

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void __thiscall cmVariableWatchCommand::~cmVariableWatchCommand(cmVariableWatchCommand *this)

{
  pointer pcVar1;
  cmake *pcVar2;
  _Rb_tree_node_base *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmVariableWatchCommand_0067bb28;
  for (p_Var3 = (this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->WatchedVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pcVar2 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    cmVariableWatch::RemoveWatch
              (pcVar2->VariableWatch,(string *)(p_Var3 + 1),cmVariableWatchCommandVariableAccessed,
               (void *)0x0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->WatchedVariables)._M_t);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_00678e70;
  pcVar1 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar4 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmVariableWatchCommand::~cmVariableWatchCommand()
{
  std::set<std::string>::const_iterator it;
  for (it = this->WatchedVariables.begin(); it != this->WatchedVariables.end();
       ++it) {
    this->Makefile->GetCMakeInstance()->GetVariableWatch()->RemoveWatch(
      *it, cmVariableWatchCommandVariableAccessed);
  }
}